

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O1

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  long lVar1;
  int iVar2;
  int iVar3;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar4;
  undefined8 uVar5;
  bool bVar6;
  void *__src;
  mz_uint64 mVar7;
  uint uVar8;
  mz_bool mVar9;
  size_t sVar10;
  int *piVar11;
  mz_uint8 *pmVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  undefined4 uVar16;
  short *psVar17;
  mz_uint8 *pmVar18;
  void *pvVar19;
  ulong uVar20;
  mz_uint8 *pmVar21;
  int *pCentral_dir_header;
  uint uVar22;
  mz_zip_array file_data_array;
  mz_uint64 local_dir_header_ofs;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat src_file_stat;
  mz_uint32 *in_stack_fffffffffffffa90;
  uint local_554;
  mz_uint8 *local_550;
  ulong local_548;
  ulong local_540;
  mz_uint8 *local_538;
  uint local_52c;
  mz_zip_array local_528;
  undefined6 uStack_508;
  undefined8 uStack_502;
  ulong local_4f0;
  mz_zip_array local_4e8;
  ulong local_4c0;
  short *local_4b8;
  ulong local_4b0;
  int local_4a8;
  byte local_4a2;
  int local_496;
  int local_492;
  ushort local_48e;
  ushort local_48c;
  mz_zip_archive_file_stat local_488;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pSource_zip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
LAB_0010d65c:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pmVar4 = pSource_zip->m_pState;
  if ((pmVar4->m_zip64 != 0) && (pArray->m_zip64 == 0)) goto LAB_0010d65c;
  if ((pmVar4 == (mz_zip_internal_state *)0x0 || pSource_zip == (mz_zip_archive *)0x0) ||
     (pSource_zip->m_total_files <= src_file_index)) {
    pCentral_dir_header = (int *)0x0;
  }
  else {
    pCentral_dir_header =
         (int *)((ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p +
                                 (ulong)src_file_index * 4) + (long)(pmVar4->m_central_dir).m_p);
  }
  if (pCentral_dir_header == (int *)0x0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (*pCentral_dir_header != 0x2014b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_4f0 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_4c0 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_52c = (uint)*(ushort *)((long)pCentral_dir_header + 0x1e);
  local_548 = (ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                      (uint)*(ushort *)(pCentral_dir_header + 7) + local_52c);
  if (((pArray->m_central_dir).m_size + local_548) - 0xffffffb1 < 0xffffffff00000001) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if (pZip->m_file_offset_alignment == 0) {
    uVar8 = 0;
  }
  else {
    iVar15 = (int)pZip->m_file_offset_alignment;
    uVar8 = iVar15 - 1;
    uVar8 = iVar15 - ((uint)pZip->m_archive_size & uVar8) & uVar8;
  }
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) goto LAB_0010d8ed;
  }
  else if (pZip->m_total_files == 0xffffffff) {
LAB_0010d8ed:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  mVar9 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&local_488,
                     (mz_bool *)0x0);
  mVar7 = local_488.m_local_header_ofs;
  if (mVar9 == 0) {
    return 0;
  }
  local_550 = (mz_uint8 *)pZip->m_archive_size;
  sVar10 = (*pSource_zip->m_pRead)
                     (pSource_zip->m_pIO_opaque,local_488.m_local_header_ofs,&local_4a8,0x1e);
  if (sVar10 != 0x1e) goto LAB_0010dcd3;
  if (local_4a8 != 0x4034b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar20 = (ulong)local_48c;
  local_538 = (mz_uint8 *)(((uint)local_48c + (uint)local_48e) + local_488.m_comp_size);
  uVar16 = 0;
  if ((local_48c != 0) && ((local_496 == -1 || (uVar16 = 0, local_492 == -1)))) {
    local_528.m_capacity._0_4_ = 0;
    local_528.m_capacity._4_4_ = 0;
    local_528._28_2_ = 0;
    local_528._30_2_ = 0;
    local_528.m_p = (short *)0x0;
    local_528.m_size = 0;
    local_528.m_element_size = 1;
    uVar13 = (ulong)local_48e;
    if ((uVar20 == 0) ||
       (local_540 = (ulong)local_48e, mVar9 = mz_zip_array_ensure_capacity(pZip,&local_528,uVar20,0)
       , uVar13 = local_540, mVar9 != 0)) {
      local_4b8 = (short *)local_528.m_p;
      local_528.m_size = uVar20;
      sVar10 = (*pSource_zip->m_pRead)
                         (pSource_zip->m_pIO_opaque,uVar13 + local_488.m_local_header_ofs + 0x1e,
                          local_528.m_p,uVar20);
      if (sVar10 != uVar20) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4b8);
        local_528.m_capacity._0_4_ = 0;
        local_528.m_capacity._4_4_ = 0;
        local_528.m_element_size = 0;
        local_528._28_2_ = 0;
        local_528._30_2_ = 0;
        local_528.m_p = (short *)0x0;
        local_528.m_size = 0;
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        goto LAB_0010d957;
      }
      local_540 = local_540 & 0xffffffff00000000;
      psVar17 = local_4b8;
      do {
        uVar22 = (uint)uVar20;
        if (uVar22 < 4) {
LAB_0010d879:
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_528.m_p);
          local_528.m_capacity._0_4_ = 0;
          local_528.m_capacity._4_4_ = 0;
          local_528.m_element_size = 0;
          local_528._28_2_ = 0;
          local_528._30_2_ = 0;
          local_528.m_p = (short *)0x0;
          local_528.m_size = 0;
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          iVar15 = 1;
LAB_0010d8ae:
          bVar6 = false;
        }
        else {
          lVar1 = (ulong)(ushort)psVar17[1] + 4;
          uVar14 = (uint)lVar1;
          if (uVar22 < uVar14) goto LAB_0010d879;
          if (*psVar17 == 1) {
            if ((ushort)psVar17[1] < 0x10) goto LAB_0010d879;
            local_540 = CONCAT44(local_540._4_4_,1);
            iVar15 = 2;
            goto LAB_0010d8ae;
          }
          psVar17 = (short *)((long)psVar17 + lVar1);
          iVar15 = 0;
          bVar6 = true;
          uVar20 = (ulong)(uVar22 - uVar14);
        }
        if (iVar15 != 0) {
          if (iVar15 != 2) goto LAB_0010d94a;
          break;
        }
      } while ((int)uVar20 != 0);
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_528.m_p);
      local_528.m_capacity._0_4_ = 0;
      local_528.m_capacity._4_4_ = 0;
      local_528.m_element_size = 0;
      local_528._28_2_ = 0;
      local_528._30_2_ = 0;
      local_528.m_p = (short *)0x0;
      local_528.m_size = 0;
      bVar6 = true;
LAB_0010d94a:
      uVar16 = (int)local_540;
    }
    else {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
LAB_0010d957:
      bVar6 = false;
      uVar16 = 0;
    }
    if (!bVar6) {
      return 0;
    }
  }
  local_540 = CONCAT44(local_540._4_4_,uVar16);
  if ((pArray->m_zip64 == 0) &&
     ((mz_uint8 *)0xfffffffe <
      local_538 + (pArray->m_central_dir).m_size + uVar8 + local_548 + (long)local_550 + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar9 = mz_zip_writer_write_zeros(pZip,(mz_uint64)local_550,uVar8);
  if (mVar9 == 0) {
    return 0;
  }
  uVar20 = (long)local_550 + (ulong)uVar8;
  local_4b0 = uVar20;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar20) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stricaud[P]faup/src/lib/miniz/miniz_zip.c"
                  ,0xfc5,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar20,&local_4a8,0x1e);
  if (sVar10 != 0x1e) {
LAB_0010e0aa:
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  pmVar12 = (mz_uint8 *)0x10000;
  if (local_538 < (mz_uint8 *)0x10000) {
    pmVar12 = local_538;
  }
  pmVar18 = (mz_uint8 *)0x20;
  if ((mz_uint8 *)0x20 < pmVar12) {
    pmVar18 = pmVar12;
  }
  piVar11 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,(size_t)pmVar18);
  if (piVar11 == (int *)0x0) goto LAB_0010e0d8;
  pmVar18 = (mz_uint8 *)(mVar7 + 0x1e);
  local_550 = (mz_uint8 *)(uVar20 + 0x1e);
  pmVar12 = local_538;
  if (local_538 == (mz_uint8 *)0x0) {
    pmVar21 = (mz_uint8 *)(ulong)local_554;
  }
  else {
    do {
      pmVar21 = (mz_uint8 *)0x10000;
      if (pmVar12 < (mz_uint8 *)0x10000) {
        pmVar21 = pmVar12;
      }
      local_538 = pmVar12;
      pmVar12 = (mz_uint8 *)
                (*pSource_zip->m_pRead)
                          (pSource_zip->m_pIO_opaque,(mz_uint64)pmVar18,piVar11,(size_t)pmVar21);
      local_554 = (uint)pmVar21;
      if (pmVar12 != pmVar21) goto LAB_0010dcc7;
      pmVar12 = (mz_uint8 *)
                (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)local_550,piVar11,(size_t)pmVar21);
      if (pmVar12 != pmVar21) goto LAB_0010e09e;
      pmVar18 = pmVar18 + (long)pmVar21;
      local_550 = local_550 + (long)pmVar21;
      pmVar12 = local_538 + -(long)pmVar21;
    } while (pmVar12 != (mz_uint8 *)0x0);
  }
  local_554 = (uint)pmVar21;
  if ((local_4a2 & 8) != 0) {
    if ((int)local_540 == 0 && pSource_zip->m_pState->m_zip64 == 0) {
      sVar10 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)pmVar18,piVar11,0x10);
      if (sVar10 == 0x10) {
        if (pZip->m_pState->m_zip64 == 0) {
          local_554 = (uint)(*piVar11 == 0x8074b50) * 4 + 0xc;
        }
        else {
          uVar20 = (ulong)(*piVar11 == 0x8074b50);
          iVar15 = piVar11[uVar20];
          iVar2 = piVar11[uVar20 + 1];
          iVar3 = piVar11[uVar20 + 2];
          *piVar11 = 0x8074b50;
          *(char *)(piVar11 + 1) = (char)iVar15;
          *(char *)((long)piVar11 + 5) = (char)((uint)iVar15 >> 8);
          *(char *)((long)piVar11 + 6) = (char)((uint)iVar15 >> 0x10);
          *(char *)((long)piVar11 + 7) = (char)((uint)iVar15 >> 0x18);
          *(char *)(piVar11 + 2) = (char)iVar2;
          *(char *)((long)piVar11 + 9) = (char)((uint)iVar2 >> 8);
          *(char *)((long)piVar11 + 10) = (char)((uint)iVar2 >> 0x10);
          *(char *)((long)piVar11 + 0xb) = (char)((uint)iVar2 >> 0x18);
          piVar11[3] = 0;
          *(char *)(piVar11 + 4) = (char)iVar3;
          *(char *)((long)piVar11 + 0x11) = (char)((uint)iVar3 >> 8);
          *(char *)((long)piVar11 + 0x12) = (char)((uint)iVar3 >> 0x10);
          *(char *)((long)piVar11 + 0x13) = (char)((uint)iVar3 >> 0x18);
          piVar11[5] = 0;
          local_554 = 0x18;
        }
      }
      else {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      }
      if (sVar10 != 0x10) {
        return 0;
      }
    }
    else {
      sVar10 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)pmVar18,piVar11,0x18);
      if (sVar10 != 0x18) {
LAB_0010dcc7:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
LAB_0010dcd3:
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        return 0;
      }
      local_554 = (uint)(*piVar11 == 0x8074b50) * 4 + 0x14;
    }
    uVar20 = (ulong)local_554;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)local_550,piVar11,uVar20);
    if (sVar10 != uVar20) {
LAB_0010e09e:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
      goto LAB_0010e0aa;
    }
    local_550 = local_550 + uVar20;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
  uVar20 = (pArray->m_central_dir).m_size;
  local_528.m_p = *(void **)pCentral_dir_header;
  local_528.m_size = *(size_t *)(pCentral_dir_header + 2);
  uVar5 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_508 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  local_528.m_capacity._0_4_ = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_528.m_capacity._4_4_ = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20)
  ;
  local_528.m_element_size = (mz_uint)uVar5;
  local_528._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
  local_528._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
  uStack_502._0_4_ = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if (((ulong)local_550 >> 0x20 != 0) || (0xfffffffe < local_4b0)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    uStack_502 = CONCAT44((int)local_4b0,(undefined4)uStack_502);
    uVar13 = uVar20 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar13) &&
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0))
    goto LAB_0010e0d8;
    (pArray->m_central_dir).m_size = uVar13;
    uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar20 * uVar13 + (long)(pArray->m_central_dir).m_p),&local_528,uVar13 * 0x2e);
    sVar10 = (pArray->m_central_dir).m_size;
    uVar13 = sVar10 + local_548;
    if (((pArray->m_central_dir).m_capacity < uVar13) &&
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0)) {
      bVar6 = true;
    }
    else {
      (pArray->m_central_dir).m_size = uVar13;
      bVar6 = false;
    }
    if (local_548 != 0 && !bVar6) {
      uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),local_548 * uVar13);
    }
joined_r0x0010df6d:
    if (!bVar6) {
      if (0xfffffffe < (pArray->m_central_dir).m_size) {
        if ((uVar20 <= (pArray->m_central_dir).m_capacity) ||
           (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,0), mVar9 != 0))
        {
          (pArray->m_central_dir).m_size = uVar20;
        }
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_554 = (uint)uVar20;
      sVar10 = (pArray->m_central_dir_offsets).m_size;
      uVar13 = sVar10 + 1;
      if ((uVar13 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar13,1),
         mVar9 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar13;
        uVar20 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar10 * uVar20 + (long)(pArray->m_central_dir_offsets).m_p),&local_554,
               uVar20);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = (mz_uint64)local_550;
        return 1;
      }
    }
  }
  else {
    local_538 = (mz_uint8 *)((long)pCentral_dir_header + local_4f0 + 0x2e);
    local_4e8.m_capacity = 0;
    local_4e8.m_p = (void *)0x0;
    local_4e8.m_size = 0;
    local_4e8.m_element_size = 1;
    local_4e8._28_4_ = 0;
    local_528.m_capacity._4_4_ = 0xffffffff;
    local_528.m_element_size = 0xffffffff;
    uStack_502 = CONCAT44(0xffffffff,(undefined4)uStack_502);
    mVar9 = mz_zip_writer_update_zip64_extension_block
                      (&local_4e8,pZip,local_538,local_52c,&local_488.m_comp_size,
                       &local_488.m_uncomp_size,&local_4b0,in_stack_fffffffffffffa90);
    if (mVar9 == 0) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
      return 0;
    }
    local_548 = local_4e8.m_size;
    local_528._30_2_ = SUB82(local_4e8.m_size,0);
    sVar10 = (pArray->m_central_dir).m_size;
    uVar13 = sVar10 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar13) &&
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e8.m_p);
      goto LAB_0010e0d8;
    }
    (pArray->m_central_dir).m_size = uVar13;
    uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),&local_528,uVar13 * 0x2e);
    sVar10 = (pArray->m_central_dir).m_size;
    uVar13 = sVar10 + local_4f0;
    if (((pArray->m_central_dir).m_capacity < uVar13) &&
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0)) {
      bVar6 = true;
    }
    else {
      (pArray->m_central_dir).m_size = uVar13;
      bVar6 = false;
    }
    if (local_4f0 != 0 && !bVar6) {
      uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),local_4f0 * uVar13);
    }
    __src = local_4e8.m_p;
    if (bVar6) {
      pvVar19 = pZip->m_pAlloc_opaque;
    }
    else {
      sVar10 = (pArray->m_central_dir).m_size;
      uVar13 = sVar10 + local_548;
      if (((pArray->m_central_dir).m_capacity < uVar13) &&
         (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0)) {
        bVar6 = true;
      }
      else {
        (pArray->m_central_dir).m_size = uVar13;
        bVar6 = false;
      }
      if (local_548 != 0 && !bVar6) {
        uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),__src,
               local_548 * uVar13);
      }
      if (!bVar6) {
        sVar10 = (pArray->m_central_dir).m_size;
        uVar13 = local_4c0 + sVar10;
        if (((pArray->m_central_dir).m_capacity < uVar13) &&
           (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0))
        {
          bVar6 = true;
        }
        else {
          (pArray->m_central_dir).m_size = uVar13;
          bVar6 = false;
        }
        if (local_4c0 != 0 && !bVar6) {
          uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),local_538 + local_52c
                 ,local_4c0 * uVar13);
        }
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,__src);
        local_4e8.m_capacity = 0;
        local_4e8.m_element_size = 0;
        local_4e8._28_4_ = 0;
        local_4e8.m_p = (void *)0x0;
        local_4e8.m_size = 0;
        goto joined_r0x0010df6d;
      }
      pvVar19 = pZip->m_pAlloc_opaque;
    }
    (*pZip->m_pFree)(pvVar19,__src);
    local_4e8.m_capacity = 0;
    local_4e8.m_element_size = 0;
    local_4e8._28_4_ = 0;
    local_4e8.m_p = (void *)0x0;
    local_4e8.m_size = 0;
  }
  if ((uVar20 <= (pArray->m_central_dir).m_capacity) ||
     (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar20,0), mVar9 != 0)) {
    (pArray->m_central_dir).m_size = uVar20;
  }
LAB_0010e0d8:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}